

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_last_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  StringPiece characters_wanted;
  unsigned_long local_158;
  unsigned_long local_150;
  size_type i;
  char *local_140;
  byte local_138 [8];
  bool lookup [256];
  size_type local_30;
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (StringPiece *)s.ptr_;
  local_30 = pos;
  pos_local = (size_type)this;
  bVar1 = empty(this);
  if ((!bVar1) && (bVar1 = empty((StringPiece *)&this_local), !bVar1)) {
    if (s_local.ptr_ == (char *)0x1) {
      sVar2 = find_last_of(this,*(char *)&this_local->ptr_,local_30);
      return sVar2;
    }
    memset(local_138,0,0x100);
    i = (size_type)this_local;
    local_140 = s_local.ptr_;
    characters_wanted.length_ = (size_type)local_138;
    characters_wanted.ptr_ = s_local.ptr_;
    BuildLookupTable((stringpiece_internal *)this_local,characters_wanted,(bool *)pos);
    local_158 = this->length_ - 1;
    puVar3 = std::min<unsigned_long>(&local_30,&local_158);
    local_150 = *puVar3;
    while( true ) {
      if ((local_138[(byte)this->ptr_[local_150]] & 1) != 0) {
        return local_150;
      }
      if (local_150 == 0) break;
      local_150 = local_150 - 1;
    }
    return 0xffffffffffffffff;
  }
  return 0xffffffffffffffff;
}

Assistant:

StringPiece::size_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (empty() || s.empty()) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (size_type i = std::min(pos, length_ - 1);; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}